

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O0

LispPTR N_OP_igreaterp(LispPTR tosm1,LispPTR tos)

{
  float fVar1;
  ushort uVar2;
  float *pfVar3;
  float temp_1;
  float temp;
  int arg2;
  int arg1;
  LispPTR tos_local;
  LispPTR tosm1_local;
  
  if ((tosm1 & 0xfff0000) == 0xe0000) {
    temp = (float)(tosm1 & 0xffff);
  }
  else if ((tosm1 & 0xfff0000) == 0xf0000) {
    temp = (float)(tosm1 | 0xffff0000);
  }
  else {
    uVar2 = *(ushort *)((ulong)(MDStypetbl + (tosm1 >> 9)) ^ 2) & 0x7ff;
    if (uVar2 == 2) {
      pfVar3 = (float *)NativeAligned4FromLAddr(tosm1);
      temp = *pfVar3;
    }
    else {
      if (uVar2 != 3) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      pfVar3 = (float *)NativeAligned4FromLAddr(tosm1);
      fVar1 = *pfVar3;
      if (2.1474836e+09 < fVar1) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if (fVar1 < 2.1474836e+09) {
        MachineState.tosvalue = tos;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      temp = (float)(int)fVar1;
    }
  }
  if ((tos & 0xfff0000) == 0xe0000) {
    temp_1 = (float)(tos & 0xffff);
  }
  else if ((tos & 0xfff0000) == 0xf0000) {
    temp_1 = (float)(tos | 0xffff0000);
  }
  else {
    uVar2 = *(ushort *)((ulong)(MDStypetbl + (tos >> 9)) ^ 2) & 0x7ff;
    if (uVar2 != 2) {
      if (uVar2 == 3) {
        pfVar3 = (float *)NativeAligned4FromLAddr(tos);
        fVar1 = *pfVar3;
        if ((fVar1 <= 2.1474836e+09) && (2.1474836e+09 <= fVar1)) {
          temp_1 = (float)(int)fVar1;
          goto LAB_00108ba0;
        }
      }
      MachineState.tosvalue = tos;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pfVar3 = (float *)NativeAligned4FromLAddr(tos);
    temp_1 = *pfVar3;
  }
LAB_00108ba0:
  if ((int)temp_1 < (int)temp) {
    tos_local = 0x4c;
  }
  else {
    tos_local = 0;
  }
  return tos_local;
}

Assistant:

LispPTR N_OP_igreaterp(LispPTR tosm1, LispPTR tos) {
  int arg1, arg2;

  N_IGETNUMBER(tosm1, arg1, do_ufn);
  N_IGETNUMBER(tos, arg2, do_ufn);

  if (arg1 > arg2)
    return (ATOM_T);
  else
    return (NIL_PTR);

do_ufn:
  ERROR_EXIT(tos);
}